

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O1

int h262_seqparm_ext(bitstream *str,h262_seqparm *seqparm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint32_t vbvh;
  uint32_t brh;
  uint32_t vsh;
  uint32_t hsh;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  local_1c = seqparm->horizontal_size >> 0xc;
  local_20 = seqparm->vertical_size >> 0xc;
  local_24 = seqparm->bit_rate >> 0x12;
  local_28 = seqparm->vbv_buffer_size >> 10;
  iVar1 = vs_u(str,&seqparm->profile_and_level_indication,8);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = vs_u(str,&seqparm->progressive_sequence,1);
    if (iVar1 == 0) {
      iVar1 = vs_u(str,&seqparm->chroma_format,2);
      if (iVar1 == 0) {
        iVar1 = vs_u(str,&local_1c,2);
        if (iVar1 == 0) {
          iVar1 = vs_u(str,&local_20,2);
          if (iVar1 == 0) {
            iVar1 = vs_u(str,&local_24,0xc);
            if (iVar1 == 0) {
              iVar1 = vs_mark(str,1,1);
              iVar2 = 1;
              if (iVar1 == 0) {
                iVar1 = vs_u(str,&local_28,8);
                if (iVar1 == 0) {
                  iVar2 = 1;
                  iVar1 = vs_u(str,&seqparm->low_delay,1);
                  if (iVar1 == 0) {
                    iVar1 = vs_u(str,&seqparm->frame_rate_extension_n,2);
                    if (iVar1 == 0) {
                      iVar1 = vs_u(str,&seqparm->frame_rate_extension_d,5);
                      if (iVar1 == 0) {
                        iVar2 = 0;
                        if (str->dir == VS_DECODE) {
                          seqparm->is_ext = 1;
                          uVar3._0_4_ = seqparm->horizontal_size;
                          uVar3._4_4_ = seqparm->vertical_size;
                          uVar3 = uVar3 | CONCAT44(local_20 << 0xc,local_1c << 0xc);
                          seqparm->horizontal_size = (int)uVar3;
                          seqparm->vertical_size = (int)(uVar3 >> 0x20);
                          seqparm->bit_rate = seqparm->bit_rate | local_24 << 0x12;
                          seqparm->vbv_buffer_size = seqparm->vbv_buffer_size | local_28 << 10;
                          iVar2 = 0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int h262_seqparm_ext(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hsh = seqparm->horizontal_size >> 12;
	uint32_t vsh = seqparm->vertical_size >> 12;
	uint32_t brh = seqparm->bit_rate >> 18;
	uint32_t vbvh = seqparm->vbv_buffer_size >> 10;
	if (vs_u(str, &seqparm->profile_and_level_indication, 8)) return 1;
	if (vs_u(str, &seqparm->progressive_sequence, 1)) return 1;
	if (vs_u(str, &seqparm->chroma_format, 2)) return 1;
	if (vs_u(str, &hsh, 2)) return 1;
	if (vs_u(str, &vsh, 2)) return 1;
	if (vs_u(str, &brh, 12)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbvh, 8)) return 1;
	if (vs_u(str, &seqparm->low_delay, 1)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_n, 2)) return 1;
	if (vs_u(str, &seqparm->frame_rate_extension_d, 5)) return 1;
	if (str->dir == VS_DECODE) {
		seqparm->is_ext = 1;
		seqparm->horizontal_size |= hsh << 12;
		seqparm->vertical_size |= vsh << 12;
		seqparm->bit_rate |= brh << 18;
		seqparm->vbv_buffer_size |= vbvh << 10;
	}
	return 0;
}